

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticmodel.cpp
# Opt level: O2

int __thiscall ArithmeticModel::init(ArithmeticModel *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  U32 UVar2;
  uint uVar3;
  U32 *pUVar4;
  U32 k;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar3 = this->symbols;
  uVar7 = (ulong)uVar3;
  if (this->distribution == (U32 *)0x0) {
    if (uVar3 - 0x801 < 0xfffff801) {
      return -1;
    }
    this->last_symbol = uVar3 - 1;
    if ((uVar3 < 0x11) || (this->compress != false)) {
      this->decoder_table = (U32 *)0x0;
      this->table_size = 0;
      this->table_shift = 0;
      pUVar4 = (U32 *)operator_new__(uVar7 * 8);
      this->distribution = pUVar4;
    }
    else {
      iVar6 = -0xd;
      do {
        cVar1 = (char)iVar6;
        iVar6 = iVar6 + 1;
      } while ((uint)(1 << (cVar1 + 0x12U & 0x1f)) < uVar3);
      UVar2 = 1 << ((char)iVar6 + 0xfU & 0x1f);
      this->table_size = UVar2;
      this->table_shift = -iVar6;
      pUVar4 = (U32 *)operator_new__((ulong)(uVar3 * 2 + UVar2) * 4 + 8);
      this->distribution = pUVar4;
      this->decoder_table = pUVar4 + uVar7 * 2;
    }
    this->symbol_count = pUVar4 + uVar7;
  }
  this->total_count = 0;
  this->update_cycle = uVar3;
  pUVar4 = this->symbol_count;
  uVar5 = 0;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    for (; uVar5 < uVar7; uVar5 = uVar5 + 1) {
      pUVar4[uVar5] = 1;
      uVar7 = (ulong)this->symbols;
    }
  }
  else {
    for (; uVar5 < uVar7; uVar5 = uVar5 + 1) {
      pUVar4[uVar5] = *(U32 *)(ctx + uVar5 * 4);
      uVar7 = (ulong)this->symbols;
    }
  }
  update(this);
  uVar3 = this->symbols + 6 >> 1;
  this->update_cycle = uVar3;
  this->symbols_until_update = uVar3;
  return 0;
}

Assistant:

I32 ArithmeticModel::init(U32* table)
{
  if (distribution == 0)
  {
    if ( (symbols < 2) || (symbols > (1 << 11)) )
    {
      return -1; // invalid number of symbols
    }
    last_symbol = symbols - 1;
    if ((!compress) && (symbols > 16))
    {
      U32 table_bits = 3;
      while (symbols > (1U << (table_bits + 2))) ++table_bits;
      table_size  = 1 << table_bits;
      table_shift = DM__LengthShift - table_bits;
      distribution = new U32[2*symbols+table_size+2];
      decoder_table = distribution + 2 * symbols;
    }
    else // small alphabet: no table needed
    {                                  
      decoder_table = 0;
      table_size = table_shift = 0;
      distribution = new U32[2*symbols];
    }
    if (distribution == 0)
    {
      return -1; // "cannot allocate model memory");
    }
    symbol_count = distribution + symbols;
  }

  total_count = 0;
  update_cycle = symbols;
  if (table)
    for (U32 k = 0; k < symbols; k++) symbol_count[k] = table[k];
  else
    for (U32 k = 0; k < symbols; k++) symbol_count[k] = 1;

  update();
  symbols_until_update = update_cycle = (symbols + 6) >> 1;

  return 0;
}